

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_edison_fab_c.c
# Opt level: O0

mraa_result_t mraa_intel_edison_misc_spi(void)

{
  mraa_gpio_context dev;
  mraa_result_t res_5;
  mraa_result_t res_4;
  mraa_result_t res_3;
  mraa_result_t res_2;
  mraa_result_t res_1;
  mraa_gpio_context io;
  mraa_result_t res;
  mraa_result_t ret;
  int i;
  
  ret = mraa_gpio_write(tristate,0);
  if (ret == MRAA_SUCCESS) {
    for (res = MRAA_SUCCESS; (int)res < mraa_intel_edison_misc_spi::pin_num;
        res = res + MRAA_ERROR_FEATURE_NOT_IMPLEMENTED) {
      dev = mraa_gpio_init_raw(mraa_intel_edison_misc_spi::gpio_pin_list[(int)res]);
      if (dev == (mraa_gpio_context)0x0) {
        syslog(3,"edison: Failed to init raw gpio %d!",
               (ulong)(uint)mraa_intel_edison_misc_spi::gpio_pin_list[(int)res]);
        return MRAA_ERROR_NO_RESOURCES;
      }
      io._4_4_ = mraa_gpio_dir(dev,mraa_intel_edison_misc_spi::gpio_dir_list[(int)res]);
      if (io._4_4_ == MRAA_SUCCESS) {
        io._4_4_ = mraa_gpio_write(dev,mraa_intel_edison_misc_spi::gpio_val_list[(int)res]);
      }
      mraa_gpio_close(dev);
      if (io._4_4_ != MRAA_SUCCESS) {
        return io._4_4_;
      }
    }
    ret = mraa_intel_edison_pinmode_change(0x73,1);
    if ((((ret == MRAA_SUCCESS) &&
         (ret = mraa_intel_edison_pinmode_change(0x72,1), ret == MRAA_SUCCESS)) &&
        (ret = mraa_intel_edison_pinmode_change(0x6d,1), ret == MRAA_SUCCESS)) &&
       (ret = mraa_gpio_write(tristate,1), ret == MRAA_SUCCESS)) {
      ret = MRAA_SUCCESS;
    }
  }
  return ret;
}

Assistant:

static mraa_result_t
mraa_intel_edison_misc_spi()
{
    // These arrays must have same length
    static const int gpio_pin_list[] = {263, 240, 262, 241, 242, 243};
    static int pin_num = sizeof(gpio_pin_list) / sizeof(int);
    static const int gpio_val_list[] = {1, 0, 1, 0, 0, 0};
    static const int gpio_dir_list[] = {MRAA_GPIO_OUT, MRAA_GPIO_OUT,
                                        MRAA_GPIO_OUT, MRAA_GPIO_OUT,
                                        MRAA_GPIO_OUT, MRAA_GPIO_OUT};
    int i;
    mraa_result_t ret;

    MRAA_RETURN_FOR_ERROR(mraa_gpio_write(tristate, 0));

    for (i = 0; i < pin_num; i++) {
        mraa_gpio_context io = mraa_gpio_init_raw(gpio_pin_list[i]);
        if (io != NULL) {
            ret = mraa_gpio_dir(io, gpio_dir_list[i]);
            if (ret == MRAA_SUCCESS) {
                ret = mraa_gpio_write(io, gpio_val_list[i]);
            }

            //Don't care return value of close()
            mraa_gpio_close(io);
            MRAA_RETURN_FOR_ERROR(ret);
        } else {
          syslog(LOG_ERR, "edison: Failed to init raw gpio %d!",gpio_pin_list[i]);
          return MRAA_ERROR_NO_RESOURCES;
        }
    }

    MRAA_RETURN_FOR_ERROR(mraa_intel_edison_pinmode_change(115, 1));
    MRAA_RETURN_FOR_ERROR(mraa_intel_edison_pinmode_change(114, 1));
    MRAA_RETURN_FOR_ERROR(mraa_intel_edison_pinmode_change(109, 1));
    MRAA_RETURN_FOR_ERROR(mraa_gpio_write(tristate, 1));

    return MRAA_SUCCESS;
}